

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_stdio.cpp
# Opt level: O0

int os_gets_timeout(uchar *buf,size_t bufl,unsigned_long timeout_in_milliseconds,int use_timeout)

{
  uchar *puVar1;
  int in_ECX;
  size_t in_RDX;
  uchar *in_RSI;
  undefined4 local_4;
  
  if (in_ECX == 0) {
    puVar1 = os_gets(in_RSI,in_RDX);
    local_4 = 6;
    if (puVar1 == (uchar *)0x0) {
      local_4 = 5;
    }
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int os_gets_timeout(unsigned char *buf, size_t bufl,
                    unsigned long timeout_in_milliseconds, int use_timeout)
{
    /* 
     *   if we've been asked to read with a timeout, we can't comply, so
     *   just return the no-timeout-available error code; if we're reading
     *   without a timeout, just use the ordinary input reader 
     */
    if (use_timeout)
    {
        /* timeout requested, no can do - return the no-timeout error code */
        return OS_EVT_NOTIMEOUT;
    }
    else
    {
        /* 
         *   no timeout requested, so use the ordinary reader, and translate
         *   its returns codes to the appropriate equivalents for this
         *   routine (null from os_gets -> error -> OS_EVT_EOF as our return
         *   code; non-null -> success -> OS_EVT_LINE) 
         */
        return (os_gets(buf, bufl) == 0 ? OS_EVT_EOF : OS_EVT_LINE);
    }
}